

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitting_settings.cpp
# Opt level: O0

void print_fitting_settings(fitting_settings *settings)

{
  ostream *poVar1;
  void *pvVar2;
  fitting_settings *settings_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Current fitting settings: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"\tImage resolution:\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,settings->resolution);
  poVar1 = std::operator<<(poVar1,"x");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,settings->resolution);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"\tMinimum roughness:\t");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,settings->min_roughness);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"\tMaximum roughness:\t");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,settings->max_roughness);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"\tError est. samples:\t");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,settings->num_error_estimate_samples);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"\tLookup output file:\t");
  poVar1 = std::operator<<(poVar1,(string *)&settings->output_file);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_fitting_settings(const fitting_settings &settings)
{
  std::cout << "Current fitting settings: " << std::endl
    << "\tImage resolution:\t" << settings.resolution << "x"
    << settings.resolution << std::endl
    << "\tMinimum roughness:\t" << settings.min_roughness << std::endl
    << "\tMaximum roughness:\t" << settings.max_roughness << std::endl
    << "\tError est. samples:\t" << settings.num_error_estimate_samples
    << std::endl << "\tLookup output file:\t" << settings.output_file
    << std::endl;
}